

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O2

void __thiscall
ser::CentralizedFileFormat::Init
          (CentralizedFileFormat *this,string *directory,string *prefix,MetainfoSet *globalMetainfo,
          FieldsTable *fieldsTable,OffsetTable *offsetTable)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  FileFormat::Init(&this->super_FileFormat,directory,prefix,globalMetainfo,fieldsTable,offsetTable);
  std::operator+(&local_50,&(this->super_FileFormat).directory_,&(this->super_FileFormat).prefix_);
  std::operator+(&local_30,&local_50,".json");
  std::__cxx11::string::operator=((string *)&this->databaseFile_,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CentralizedFileFormat::Init(const std::string& directory, const std::string& prefix,
                                 MetainfoSet& globalMetainfo, FieldsTable& fieldsTable, OffsetTable& offsetTable)
{
    FileFormat::Init(directory, prefix, globalMetainfo, fieldsTable, offsetTable);
    databaseFile_ = directory_ + prefix_ + ".json";
}